

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::SetSerializedPbInterval
          (Generator *this,FileDescriptorProto *file)

{
  EnumDescriptor *pEVar1;
  ServiceDescriptor *pSVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *descriptor_proto;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *message_proto;
  Nonnull<const_char_*> pcVar3;
  FileDescriptor *pFVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *descriptor_proto_00;
  undefined8 extraout_RAX;
  long v2;
  long lVar5;
  long lVar6;
  string_view name;
  string_view name_00;
  string local_50;
  
  pFVar4 = this->file_;
  if (0 < pFVar4->enum_type_count_) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      pEVar1 = pFVar4->enum_types_;
      descriptor_proto =
           protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                     (&(file->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,(int)lVar6);
      ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
                (&local_50,this,(EnumDescriptor *)(&pEVar1->super_SymbolBase + lVar5));
      name._M_str = local_50._M_dataplus._M_p;
      name._M_len = local_50._M_string_length;
      PrintSerializedPbInterval<google::protobuf::EnumDescriptorProto>(this,descriptor_proto,name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar6 = lVar6 + 1;
      pFVar4 = this->file_;
      lVar5 = lVar5 + 0x58;
    } while (lVar6 < pFVar4->enum_type_count_);
  }
  if (0 < this->file_->message_type_count_) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      message_proto =
           protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(file->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,(int)lVar6);
      pFVar4 = this->file_;
      v2 = (long)pFVar4->message_type_count_;
      if (lVar6 < v2) {
        pcVar3 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (lVar6,v2,"index < message_type_count()");
      }
      if (pcVar3 != (Nonnull<const_char_*>)0x0) {
        SetSerializedPbInterval();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      SetMessagePbInterval
                (this,message_proto,
                 (Descriptor *)(&pFVar4->message_types_->super_SymbolBase + lVar5));
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0xa0;
    } while (lVar6 < this->file_->message_type_count_);
  }
  pFVar4 = this->file_;
  if (0 < pFVar4->service_count_) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      pSVar2 = pFVar4->services_;
      descriptor_proto_00 =
           protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                     (&(file->field_0)._impl_.service_.super_RepeatedPtrFieldBase,(int)lVar6);
      ModuleLevelServiceDescriptorName_abi_cxx11_
                (&local_50,this,(ServiceDescriptor *)(&pSVar2->super_SymbolBase + lVar5));
      name_00._M_str = local_50._M_dataplus._M_p;
      name_00._M_len = local_50._M_string_length;
      PrintSerializedPbInterval<google::protobuf::ServiceDescriptorProto>
                (this,descriptor_proto_00,name_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar6 = lVar6 + 1;
      pFVar4 = this->file_;
      lVar5 = lVar5 + 0x40;
    } while (lVar6 < pFVar4->service_count_);
  }
  return;
}

Assistant:

void Generator::SetSerializedPbInterval(const FileDescriptorProto& file) const {
  // Top level enums.
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& descriptor = *file_->enum_type(i);
    PrintSerializedPbInterval(file.enum_type(i),
                              ModuleLevelDescriptorName(descriptor));
  }

  // Messages.
  for (int i = 0; i < file_->message_type_count(); ++i) {
    SetMessagePbInterval(file.message_type(i), *file_->message_type(i));
  }

  // Services.
  for (int i = 0; i < file_->service_count(); ++i) {
    const ServiceDescriptor& service = *file_->service(i);
    PrintSerializedPbInterval(file.service(i),
                              ModuleLevelServiceDescriptorName(service));
  }
}